

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall RPCCommandExecution::~RPCCommandExecution(RPCCommandExecution *this)

{
  long lVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock10,&g_rpc_server_info.mutex,"g_rpc_server_info.mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
             ,0x43,false);
  std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::erase
            (&g_rpc_server_info.active_commands,(this->it)._M_node);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RPCCommandExecution()
    {
        LOCK(g_rpc_server_info.mutex);
        g_rpc_server_info.active_commands.erase(it);
    }